

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O1

value signature_metadata(signature s)

{
  value pvVar1;
  value *ppvVar2;
  value pvVar3;
  value pvVar4;
  value pvVar5;
  value *ppvVar6;
  value v;
  value *ppvVar7;
  size_t length;
  value pvVar8;
  signature psVar9;
  set __s;
  signature psVar10;
  ulong uVar11;
  
  pvVar1 = value_create_array((value *)0x0,2);
  pvVar3 = (value)0x0;
  if (pvVar1 != (value)0x0) {
    ppvVar2 = value_to_array(pvVar1);
    pvVar3 = value_create_string("ret",3);
    *ppvVar2 = pvVar3;
    if (pvVar3 != (value)0x0) {
      pvVar3 = value_create_map((value *)0x0,1);
      ppvVar2[1] = pvVar3;
      if (pvVar3 != (value)0x0) {
        ppvVar2 = value_to_map(pvVar3);
        pvVar4 = type_metadata(s->ret);
        *ppvVar2 = pvVar4;
        pvVar3 = pvVar1;
        if (pvVar4 != (value)0x0) goto LAB_0011b561;
      }
    }
    value_type_destroy(pvVar1);
    pvVar3 = (value)0x0;
  }
LAB_0011b561:
  if (pvVar3 == (value)0x0) {
    return (value)0x0;
  }
  pvVar4 = value_create_array((value *)0x0,s->count);
  pvVar1 = (value)0x0;
  if (((pvVar4 != (value)0x0) && (pvVar1 = pvVar4, s->count != 0)) &&
     (ppvVar2 = value_to_array(pvVar4), s->count != 0)) {
    psVar10 = s + 1;
    uVar11 = 0;
    do {
      psVar9 = psVar10;
      if (s == (signature)0x0) {
        psVar9 = (signature)0x0;
      }
      pvVar5 = value_create_map((value *)0x0,2);
      ppvVar2[uVar11] = pvVar5;
      if (pvVar5 == (value)0x0) {
LAB_0011b6be:
        value_type_destroy(pvVar4);
        pvVar1 = (value)0x0;
        break;
      }
      ppvVar6 = value_to_map(pvVar5);
      __s = psVar9->map;
      v = value_create_array((value *)0x0,2);
      pvVar5 = (value)0x0;
      if (v != (value)0x0) {
        ppvVar7 = value_to_array(v);
        pvVar5 = value_create_string("name",4);
        *ppvVar7 = pvVar5;
        if (pvVar5 != (value)0x0) {
          if (__s == (set)0x0) {
            __s = (set)0x12c33c;
            length = 0;
          }
          else {
            length = strlen((char *)__s);
          }
          pvVar8 = value_create_string((char *)__s,length);
          ppvVar7[1] = pvVar8;
          pvVar5 = v;
          if (pvVar8 != (value)0x0) goto LAB_0011b67f;
        }
        value_type_destroy(v);
        pvVar5 = (value)0x0;
      }
LAB_0011b67f:
      *ppvVar6 = pvVar5;
      if (pvVar5 == (value)0x0) goto LAB_0011b6be;
      pvVar5 = type_metadata((type_conflict)psVar9->count);
      ppvVar6[1] = pvVar5;
      if (pvVar5 == (value)0x0) goto LAB_0011b6be;
      uVar11 = uVar11 + 1;
      psVar10 = psVar10 + 1;
    } while (uVar11 < s->count);
  }
  if (pvVar1 != (value)0x0) {
    pvVar4 = value_create_array((value *)0x0,2);
    if (pvVar4 == (value)0x0) {
      pvVar4 = (value)0x0;
      value_type_destroy((value)0x0);
      goto LAB_0011b729;
    }
    ppvVar2 = value_to_array(pvVar4);
    pvVar5 = value_create_string("args",4);
    *ppvVar2 = pvVar5;
    if (pvVar5 != (value)0x0) {
      ppvVar2[1] = pvVar1;
      goto LAB_0011b729;
    }
    value_type_destroy(pvVar4);
  }
  pvVar4 = (value)0x0;
LAB_0011b729:
  if (pvVar4 != (value)0x0) {
    pvVar1 = value_create_map((value *)0x0,2);
    if (pvVar1 != (value)0x0) {
      ppvVar2 = value_to_map(pvVar1);
      *ppvVar2 = pvVar3;
      ppvVar2[1] = pvVar4;
      return pvVar1;
    }
    value_type_destroy(pvVar3);
    pvVar3 = pvVar4;
  }
  value_type_destroy(pvVar3);
  return (value)0x0;
}

Assistant:

value signature_metadata(signature s)
{
	value ret, args, sig;
	value *sig_map;

	/* Create return array */
	ret = signature_metadata_return(s);

	if (ret == NULL)
	{
		return NULL;
	}

	/* Create arguments map */
	args = signature_metadata_args(s);

	if (args == NULL)
	{
		value_type_destroy(ret);

		return NULL;
	}

	/* Create signature map (return type + args) */
	sig = value_create_map(NULL, 2);

	if (sig == NULL)
	{
		value_type_destroy(ret);
		value_type_destroy(args);

		return NULL;
	}

	sig_map = value_to_map(sig);

	sig_map[0] = ret;
	sig_map[1] = args;

	return sig;
}